

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cc
# Opt level: O3

void xemmai::t_engine::t_engine::anon_class_1_0_00000001::__invoke(void)

{
  long in_FS_OFFSET;
  
  f_tick(*(t_engine **)(in_FS_OFFSET + -0x60));
  return;
}

Assistant:

t_engine::t_engine(const t_options& a_options, size_t a_count, char** a_arguments) : v_object__heap([]
{
	v_instance->f_tick();
}), v_options(a_options)
{
	v_instance = this;
	v_collector__running.test_and_set(std::memory_order_relaxed);
#ifdef __unix__
	if (sem_init(&v_epoch__received, 0, 0) == -1) portable::f_throw_system_error();
	sigfillset(&v_epoch__not_signal_resume);
	sigdelset(&v_epoch__not_signal_resume, XEMMAI__SIGNAL_RESUME);
	struct sigaction sa;
	sa.sa_handler = [](int)
	{
	};
	sigemptyset(&sa.sa_mask);
	sa.sa_flags = SA_RESTART;
	if (sigaction(XEMMAI__SIGNAL_RESUME, &sa, &v_epoch__old_signal_resume) == -1) portable::f_throw_system_error();
	sa.sa_handler = [](int)
	{
		t_thread::v_current->v_active->f_epoch_get();
		t_thread::v_current->f_epoch_get();
		v_instance->f_epoch_suspend();
	};
	sigaddset(&sa.sa_mask, XEMMAI__SIGNAL_RESUME);
	if (sigaction(XEMMAI__SIGNAL_SUSPEND, &sa, &v_epoch__old_signal_suspend) == -1) portable::f_throw_system_error();
#endif
	v_thread__internals = new t_thread::t_internal{nullptr};
	v_thread__internals->f_initialize(v_options.v_stack_size, this);
	std::thread(&t_engine::f_collector, this).detach();
	auto type_object = f_allocate_for_type<t_type>(t_type::c_FIELDS);
	auto type = new(type_object->f_data()) t_type;
	type->v_derive = &t_type::f_do_derive;
	std::uninitialized_default_construct_n(type->f_fields(), t_type::c_FIELDS);
	auto type_type = f_allocate_for_type<t_class>(0);
	v_type_type = new(type_type->f_data()) t_class(t_class::c_IDS, type);
	type_object->f_be(v_type_type);
	type_type->f_be(v_type_type);
	{
		auto type_module__body = f_new_type_on_boot<t_module::t_body>(t_type::c_FIELDS, type, nullptr);
		auto global = type_module__body->f_as<t_type>().f_new<t_global>(type_object, type_type, type_module__body);
		v_module_global = t_module::f_new(L"__global"sv, global, global->f_as<t_global>().f_define());
	}
	v_fiber_exit = f_allocate(0);
	v_fiber_exit->f_be(type);
	auto global = f_global();
	v_thread = f_new<t_thread>(global, v_thread__internals, f_new<t_fiber>(global, nullptr, v_options.v_stack_size));
	v_thread__internals->f_initialize(&v_thread->f_as<t_thread>());
	auto path = t_list::f_instantiate();
	path->f_as<t_list>().v_owner = nullptr;
	if (auto p = std::getenv("XEMMAI_MODULE_PATH")) {
		std::wstring s = portable::f_convert(p);
#ifdef _WIN32
		s.erase(std::remove(s.begin(), s.end(), L'"'), s.end());
#endif
		std::wstring_view sv = s;
		size_t i = 0;
		while (true) {
#ifdef __unix__
			size_t j = sv.find(L':', i);
#endif
#ifdef _WIN32
			size_t j = sv.find(L';', i);
#endif
			if (j == std::wstring_view::npos) break;
			if (i < j) path->f_as<t_list>().f_push(global->f_as(sv.substr(i, j - i)));
			i = j + 1;
		}
		if (i < sv.size()) path->f_as<t_list>().f_push(global->f_as(sv.substr(i)));
	}
	std::wstring executable;
	portable::t_path script({});
	auto arguments = t_list::f_instantiate();
	if (a_count > 0) {
		executable = portable::f_convert(a_arguments[0]);
#ifdef XEMMAI_MODULE_PATH
		path->f_as<t_list>().f_push(global->f_as(static_cast<const std::wstring&>(portable::t_path(portable::f_executable_path()) / std::wstring_view(L"../" XEMMAI__MACRO__LQ(XEMMAI_MODULE_PATH)))));
#endif
		if (a_count > 1) {
			script = {portable::f_convert(a_arguments[1])};
			path->f_as<t_list>().f_push(global->f_as(static_cast<const std::wstring&>(script / L".."sv)));
			auto& as = arguments->f_as<t_list>();
			for (size_t i = 2; i < a_count; ++i) as.f_push(global->f_as(portable::f_convert(a_arguments[i])));
		}
	}
	t_define system(global);
	system(L"path"sv, path);
	system(L"executable"sv, executable);
	system(L"script"sv, static_cast<const std::wstring&>(script));
	system(L"arguments"sv, arguments);
	{
		auto io = global->f_type<t_module::t_body>()->f_new<t_io>();
		v_module_io = t_module::f_new(L"io"sv, io, io->f_as<t_io>().f_define());
	}
	{
		auto file = io::t_file::f_instantiate(0, false);
		system(L"raw_in"sv, file);
		auto tty = file->f_as<io::t_file>().f_tty();
		system(L"in"sv, io::t_reader::f_instantiate(file, L""sv, tty ? 1 : 1024));
	}
	{
		auto file = io::t_file::f_instantiate(1, false);
		file->f_as<io::t_file>().f_share();
		system(L"raw_out"sv, file);
		auto writer = io::t_writer::f_instantiate(file, L""sv);
		writer->f_as<io::t_writer>().f_share();
		system(L"out"sv, writer);
	}
	{
		auto file = io::t_file::f_instantiate(2, false);
		file->f_as<io::t_file>().f_share();
		system(L"raw_error"sv, file);
		auto writer = io::t_writer::f_instantiate(file, L""sv);
		writer->f_as<io::t_writer>().f_share();
		system(L"error"sv, writer);
	}
	v_module_system = t_module::f_new(L"system"sv, nullptr, system);
}